

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

void sk_net_write_eof(Socket *sock)

{
  NetSocket *s;
  Socket *sock_local;
  
  if (*(int *)((long)&sock[-8].vt + 4) == 0) {
    *(undefined4 *)((long)&sock[-8].vt + 4) = 1;
    if (((ulong)sock[-10].vt & 0x100) != 0) {
      try_send((NetSocket *)(sock + -0x12));
    }
    uxsel_tell((NetSocket *)(sock + -0x12));
    return;
  }
  __assert_fail("s->outgoingeof == EOF_NO",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c",
                0x4df,"void sk_net_write_eof(Socket *)");
}

Assistant:

static void sk_net_write_eof(Socket *sock)
{
    NetSocket *s = container_of(sock, NetSocket, sock);

    assert(s->outgoingeof == EOF_NO);

    /*
     * Mark the socket as pending outgoing EOF.
     */
    s->outgoingeof = EOF_PENDING;

    /*
     * Now try sending from the start of the buffer list.
     */
    if (s->writable)
        try_send(s);

    /*
     * Update the select() status to correctly reflect whether or
     * not we should be selecting for write.
     */
    uxsel_tell(s);
}